

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenTypeFileInput.cpp
# Opt level: O3

EStatusCode __thiscall
OpenTypeFileInput::ReadOpenTypeFile
          (OpenTypeFileInput *this,string *inFontFilePath,unsigned_short inFaceIndex)

{
  EStatusCode EVar1;
  Trace *this_00;
  IByteReaderWithPosition *inTrueTypeFile;
  InputFile fontFile;
  InputFile local_50;
  
  InputFile::InputFile(&local_50);
  EVar1 = InputFile::OpenFile(&local_50,inFontFilePath);
  if (EVar1 == eSuccess) {
    inTrueTypeFile = InputFile::GetInputStream(&local_50);
    EVar1 = ReadOpenTypeFile(this,inTrueTypeFile,inFaceIndex);
    InputFile::CloseFile(&local_50);
  }
  else {
    this_00 = Trace::DefaultTrace();
    Trace::TraceToLog(this_00,
                      "OpenTypeFileInput::ReadOpenTypeFile, cannot open true type font file at %s",
                      (inFontFilePath->_M_dataplus)._M_p);
  }
  InputFile::~InputFile(&local_50);
  return EVar1;
}

Assistant:

EStatusCode OpenTypeFileInput::ReadOpenTypeFile(const std::string& inFontFilePath, unsigned short inFaceIndex)
{
	InputFile fontFile;

	EStatusCode status = fontFile.OpenFile(inFontFilePath);
	if(status != PDFHummus::eSuccess)
	{
		TRACE_LOG1("OpenTypeFileInput::ReadOpenTypeFile, cannot open true type font file at %s",inFontFilePath.c_str());
		return status;
	}

	status = ReadOpenTypeFile(fontFile.GetInputStream(), inFaceIndex);
	fontFile.CloseFile();
	return status;
}